

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroLiFloat
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  string *psVar1;
  undefined4 in_register_0000000c;
  uint in_R8D;
  initializer_list<AssemblyTemplateArgument> variables;
  AssemblyTemplateArgument *local_100;
  AssemblyTemplateArgument local_b8;
  char *local_90;
  string local_88 [32];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  string macroText;
  char *templateLiFloat;
  int flags_local;
  MipsImmediateData *immediates_local;
  MipsRegisterData *registers_local;
  Parser *parser_local;
  
  macroText.field_2._8_8_ = anon_var_dwarf_29955b;
  preprocessMacro_abi_cxx11_
            ((string *)local_58,"\n\t\tli \t\tr1,float(%imm%)\n\t\tmtc1\tr1,%rs%\n\t",
             (MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_b8.variableName = "%imm%";
  Expression::toString_abi_cxx11_
            (&local_b8.value,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->secondary).expression);
  local_90 = "%rs%";
  psVar1 = Identifier::string_abi_cxx11_((Identifier *)&immediates[1].secondary.value);
  std::__cxx11::string::string(local_88,(string *)psVar1);
  variables._M_array = (iterator)(ulong)in_R8D;
  local_68._0_8_ = &local_b8;
  local_68._8_8_ = 2;
  variables._M_len = local_68._0_8_;
  createMacro(parser,(string *)registers,(int)local_58,variables);
  local_100 = (AssemblyTemplateArgument *)local_68;
  do {
    local_100 = local_100 + -1;
    AssemblyTemplateArgument::~AssemblyTemplateArgument(local_100);
  } while (local_100 != &local_b8);
  std::__cxx11::string::~string((string *)local_58);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroLiFloat(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateLiFloat = R"(
		li 		r1,float(%imm%)
		mtc1	r1,%rs%
	)";

	std::string macroText = preprocessMacro(templateLiFloat,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%imm%",		immediates.secondary.expression.toString() },
			{ "%rs%",		registers.frs.name.string() },
	});
}